

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_read_eoc(opj_j2k_t *j2k)

{
  int iVar1;
  opj_bool oVar2;
  opj_tcd_t *tcd_00;
  long in_RDI;
  opj_tcd_t *tcd;
  opj_bool success;
  int tileno;
  int i;
  opj_cp_t *in_stack_00000030;
  opj_image_t *in_stack_00000038;
  opj_tcd_t *in_stack_00000040;
  opj_codestream_info_t *in_stack_000000b0;
  int in_stack_000000b8;
  int in_stack_000000bc;
  uchar *in_stack_000000c0;
  opj_tcd_t *in_stack_000000c8;
  opj_codestream_info_t *in_stack_000000f0;
  int in_stack_000000fc;
  opj_cp_t *in_stack_00000100;
  opj_image_t *in_stack_00000108;
  opj_tcd_t *in_stack_00000110;
  opj_common_ptr in_stack_ffffffffffffffd8;
  undefined4 local_c;
  
  if (*(int *)(*(long *)(in_RDI + 0x60) + 0x2c) == 2) {
    for (local_c = 0; local_c < *(int *)(*(long *)(in_RDI + 0x60) + 0x58); local_c = local_c + 1) {
      iVar1 = *(int *)(*(long *)(*(long *)(in_RDI + 0x60) + 0x50) + (long)local_c * 4);
      free(*(void **)(*(long *)(in_RDI + 0x40) + (long)iVar1 * 8));
      *(undefined8 *)(*(long *)(in_RDI + 0x40) + (long)iVar1 * 8) = 0;
    }
  }
  else {
    tcd_00 = tcd_create(in_stack_ffffffffffffffd8);
    tcd_malloc_decode(in_stack_00000040,in_stack_00000038,in_stack_00000030);
    for (local_c = 0; local_c < *(int *)(*(long *)(in_RDI + 0x60) + 0x58); local_c = local_c + 1) {
      tcd_malloc_decode_tile
                (in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000fc,
                 in_stack_000000f0);
      iVar1 = *(int *)(*(long *)(*(long *)(in_RDI + 0x60) + 0x50) + (long)local_c * 4);
      oVar2 = tcd_decode_tile(in_stack_000000c8,in_stack_000000c0,in_stack_000000bc,
                              in_stack_000000b8,in_stack_000000b0);
      free(*(void **)(*(long *)(in_RDI + 0x40) + (long)iVar1 * 8));
      *(undefined8 *)(*(long *)(in_RDI + 0x40) + (long)iVar1 * 8) = 0;
      tcd_free_decode_tile((opj_tcd_t *)j2k,i);
      if (oVar2 == 0) {
        *(uint *)(in_RDI + 8) = *(uint *)(in_RDI + 8) | 0x8000;
        break;
      }
    }
    tcd_free_decode(tcd_00);
    tcd_destroy((opj_tcd_t *)0x2ae183);
  }
  if ((*(uint *)(in_RDI + 8) & 0x8000) == 0) {
    *(undefined4 *)(in_RDI + 8) = 0x20;
  }
  else {
    *(undefined4 *)(in_RDI + 8) = 0x8020;
  }
  return;
}

Assistant:

static void j2k_read_eoc(opj_j2k_t *j2k) {
	int i, tileno;
	opj_bool success;

	/* if packets should be decoded */
	if (j2k->cp->limit_decoding != DECODE_ALL_BUT_PACKETS) {
		opj_tcd_t *tcd = tcd_create(j2k->cinfo);
		tcd_malloc_decode(tcd, j2k->image, j2k->cp);
		for (i = 0; i < j2k->cp->tileno_size; i++) {
			tcd_malloc_decode_tile(tcd, j2k->image, j2k->cp, i, j2k->cstr_info);
			tileno = j2k->cp->tileno[i];
			success = tcd_decode_tile(tcd, j2k->tile_data[tileno], j2k->tile_len[tileno], tileno, j2k->cstr_info);
			opj_free(j2k->tile_data[tileno]);
			j2k->tile_data[tileno] = NULL;
			tcd_free_decode_tile(tcd, i);
			if (success == OPJ_FALSE) {
				j2k->state |= J2K_STATE_ERR;
				break;
			}
		}
		tcd_free_decode(tcd);
		tcd_destroy(tcd);
	}
	/* if packets should not be decoded  */
	else {
		for (i = 0; i < j2k->cp->tileno_size; i++) {
			tileno = j2k->cp->tileno[i];
			opj_free(j2k->tile_data[tileno]);
			j2k->tile_data[tileno] = NULL;
		}
	}	
	if (j2k->state & J2K_STATE_ERR)
		j2k->state = J2K_STATE_MT + J2K_STATE_ERR;
	else
		j2k->state = J2K_STATE_MT; 
}